

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeySymToKeyMapping.cpp
# Opt level: O1

KeySym sf::priv::keyToKeySym(Key key)

{
  if ((uint)key < 0x65) {
    return *(KeySym *)(&DAT_001b2da8 + (ulong)(uint)key * 8);
  }
  return 0;
}

Assistant:

KeySym keyToKeySym(Keyboard::Key key)
{
    switch (key)
    {
        case Keyboard::LShift:     return XK_Shift_L;
        case Keyboard::RShift:     return XK_Shift_R;
        case Keyboard::LControl:   return XK_Control_L;
        case Keyboard::RControl:   return XK_Control_R;
        case Keyboard::LAlt:       return XK_Alt_L;
        case Keyboard::RAlt:       return XK_Alt_R;
        case Keyboard::LSystem:    return XK_Super_L;
        case Keyboard::RSystem:    return XK_Super_R;
        case Keyboard::Menu:       return XK_Menu;
        case Keyboard::Escape:     return XK_Escape;
        case Keyboard::SemiColon:  return XK_semicolon;
        case Keyboard::Slash:      return XK_slash;
        case Keyboard::Equal:      return XK_equal;
        case Keyboard::Dash:       return XK_minus;
        case Keyboard::LBracket:   return XK_bracketleft;
        case Keyboard::RBracket:   return XK_bracketright;
        case Keyboard::Comma:      return XK_comma;
        case Keyboard::Period:     return XK_period;
        case Keyboard::Quote:      return XK_apostrophe;
        case Keyboard::BackSlash:  return XK_backslash;
        case Keyboard::Grave:      return XK_grave;
        case Keyboard::Space:      return XK_space;
        case Keyboard::Return:     return XK_Return;
        case Keyboard::BackSpace:  return XK_BackSpace;
        case Keyboard::Tab:        return XK_Tab;
        case Keyboard::PageUp:     return XK_Prior;
        case Keyboard::PageDown:   return XK_Next;
        case Keyboard::End:        return XK_End;
        case Keyboard::Home:       return XK_Home;
        case Keyboard::Insert:     return XK_Insert;
        case Keyboard::Delete:     return XK_Delete;
        case Keyboard::Add:        return XK_KP_Add;
        case Keyboard::Subtract:   return XK_KP_Subtract;
        case Keyboard::Multiply:   return XK_KP_Multiply;
        case Keyboard::Divide:     return XK_KP_Divide;
        case Keyboard::Pause:      return XK_Pause;
        case Keyboard::F1:         return XK_F1;
        case Keyboard::F2:         return XK_F2;
        case Keyboard::F3:         return XK_F3;
        case Keyboard::F4:         return XK_F4;
        case Keyboard::F5:         return XK_F5;
        case Keyboard::F6:         return XK_F6;
        case Keyboard::F7:         return XK_F7;
        case Keyboard::F8:         return XK_F8;
        case Keyboard::F9:         return XK_F9;
        case Keyboard::F10:        return XK_F10;
        case Keyboard::F11:        return XK_F11;
        case Keyboard::F12:        return XK_F12;
        case Keyboard::F13:        return XK_F13;
        case Keyboard::F14:        return XK_F14;
        case Keyboard::F15:        return XK_F15;
        case Keyboard::Left:       return XK_Left;
        case Keyboard::Right:      return XK_Right;
        case Keyboard::Up:         return XK_Up;
        case Keyboard::Down:       return XK_Down;
        case Keyboard::Numpad0:    return XK_KP_Insert;
        case Keyboard::Numpad1:    return XK_KP_End;
        case Keyboard::Numpad2:    return XK_KP_Down;
        case Keyboard::Numpad3:    return XK_KP_Page_Down;
        case Keyboard::Numpad4:    return XK_KP_Left;
        case Keyboard::Numpad5:    return XK_KP_Begin;
        case Keyboard::Numpad6:    return XK_KP_Right;
        case Keyboard::Numpad7:    return XK_KP_Home;
        case Keyboard::Numpad8:    return XK_KP_Up;
        case Keyboard::Numpad9:    return XK_KP_Page_Up;
        case Keyboard::A:          return XK_a;
        case Keyboard::B:          return XK_b;
        case Keyboard::C:          return XK_c;
        case Keyboard::D:          return XK_d;
        case Keyboard::E:          return XK_e;
        case Keyboard::F:          return XK_f;
        case Keyboard::G:          return XK_g;
        case Keyboard::H:          return XK_h;
        case Keyboard::I:          return XK_i;
        case Keyboard::J:          return XK_j;
        case Keyboard::K:          return XK_k;
        case Keyboard::L:          return XK_l;
        case Keyboard::M:          return XK_m;
        case Keyboard::N:          return XK_n;
        case Keyboard::O:          return XK_o;
        case Keyboard::P:          return XK_p;
        case Keyboard::Q:          return XK_q;
        case Keyboard::R:          return XK_r;
        case Keyboard::S:          return XK_s;
        case Keyboard::T:          return XK_t;
        case Keyboard::U:          return XK_u;
        case Keyboard::V:          return XK_v;
        case Keyboard::W:          return XK_w;
        case Keyboard::X:          return XK_x;
        case Keyboard::Y:          return XK_y;
        case Keyboard::Z:          return XK_z;
        case Keyboard::Num0:       return XK_0;
        case Keyboard::Num1:       return XK_1;
        case Keyboard::Num2:       return XK_2;
        case Keyboard::Num3:       return XK_3;
        case Keyboard::Num4:       return XK_4;
        case Keyboard::Num5:       return XK_5;
        case Keyboard::Num6:       return XK_6;
        case Keyboard::Num7:       return XK_7;
        case Keyboard::Num8:       return XK_8;
        case Keyboard::Num9:       return XK_9;
        default:                   return NoSymbol;
    }
}